

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rectangle.cpp
# Opt level: O0

void __thiscall pm::Rectangle::Rectangle(Rectangle *this,Vector3 *point,Vector3 *a,Vector3 *b)

{
  Vector3 local_34;
  Vector3 *local_28;
  Vector3 *b_local;
  Vector3 *a_local;
  Vector3 *point_local;
  Rectangle *this_local;
  
  local_28 = b;
  b_local = a;
  a_local = point;
  point_local = (Vector3 *)this;
  cross((pm *)&local_34,a,b);
  Rectangle(this,point,a,b,&local_34);
  updateDimensions(this);
  return;
}

Assistant:

Rectangle::Rectangle(const Vector3 &point, const Vector3 &a, const Vector3 &b)
    : Rectangle(point, a, b, cross(a, b))
{
	updateDimensions();
}